

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsTagAllocate(FmsTag tag,FmsIntType stored_tag_type,void **ent_tags,FmsInt *num_ents)

{
  long lVar1;
  void *pvVar2;
  long *in_RCX;
  undefined8 *in_RDX;
  uint in_ESI;
  long in_RDI;
  FmsInt num_entities;
  FmsComponent comp;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_ESI < 8) {
    if ((*(int *)(in_RDI + 0x18) == 8) || (*(uint *)(in_RDI + 0x18) == in_ESI)) {
      if (in_RDX == (undefined8 *)0x0) {
        local_4 = 4;
      }
      else {
        lVar1 = *(long *)(in_RDI + 8);
        if (lVar1 == 0) {
          local_4 = 5;
        }
        else {
          free(*(void **)(in_RDI + 0x20));
          *(undefined8 *)(in_RDI + 0x20) = 0;
          lVar1 = *(long *)(lVar1 + 0x18);
          if (lVar1 != 0) {
            pvVar2 = malloc(lVar1 * FmsIntTypeSize[in_ESI]);
            *(void **)(in_RDI + 0x20) = pvVar2;
            if (*(long *)(in_RDI + 0x20) == 0) {
              return 6;
            }
          }
          *(uint *)(in_RDI + 0x18) = in_ESI;
          *in_RDX = *(undefined8 *)(in_RDI + 0x20);
          if (in_RCX != (long *)0x0) {
            *in_RCX = lVar1;
          }
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsTagAllocate(FmsTag tag, FmsIntType stored_tag_type, void **ent_tags,
                   FmsInt *num_ents) {
  if (!tag) { E_RETURN(1); }
  if (stored_tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (tag->tag_type != FMS_NUM_INT_TYPES && tag->tag_type != stored_tag_type) {
    E_RETURN(3);
  }
  if (ent_tags == NULL) { E_RETURN(4); }
  FmsComponent comp = tag->comp;
  if (!comp) { E_RETURN(5); }
  free(tag->tags);
  tag->tags = NULL;
  FmsInt num_entities = comp->num_main_entities;
  if (num_entities != 0) {
    tag->tags = malloc(num_entities*FmsIntTypeSize[stored_tag_type]);
    if (tag->tags == NULL) { E_RETURN(6); }
  }
  tag->tag_type = stored_tag_type;
  *ent_tags = tag->tags;
  if (num_ents != NULL) { *num_ents = num_entities; }
  return 0;
}